

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> __thiscall
enact::Parser::expectTypenamePrecPrimary(Parser *this,string *msg,bool emptyAllowed)

{
  bool bVar1;
  ParseError *__return_storage_ptr__;
  char in_CL;
  undefined7 in_register_00000011;
  allocator<char> local_a9;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_a8;
  undefined1 local_a0 [8];
  vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  elementTypenames;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80 [2];
  Token paren;
  
  bVar1 = consume((Parser *)msg,IDENTIFIER);
  if (bVar1) {
    std::make_unique<enact::BasicTypename,enact::Token&>(&paren);
    this->m_context = (CompileContext *)paren._0_8_;
  }
  else {
    local_a8._M_head_impl = (Typename *)this;
    bVar1 = consume((Parser *)msg,DOLLAR);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&paren,"Expected type variable name after \'$\'.",
                 (allocator<char> *)local_80[0]._M_local_buf);
      expect((Parser *)msg,IDENTIFIER,(string *)&paren);
      std::__cxx11::string::~string((string *)&paren);
      std::make_unique<enact::VariableTypename,enact::Token&>(&paren);
    }
    else {
      bVar1 = consume((Parser *)msg,LEFT_PAREN);
      if (bVar1) {
        Token::Token(&paren,(Token *)&msg[5].field_2);
        elementTypenames.
        super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        elementTypenames.
        super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        elementTypenames.
        super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (*(int *)&msg[7]._M_dataplus._M_p != 1) {
          do {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_80[0]._M_local_buf,"Expected typename after \'(\'.",&local_a9
                      );
            expectTypenamePrecFunction((Parser *)local_a0,msg,SUB81(local_80,0));
            std::
            vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
            ::
            emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
                      ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                        *)&elementTypenames,
                       (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                        *)local_a0);
            if (local_a0 != (undefined1  [8])0x0) {
              (**(code **)((((string *)local_a0)->_M_dataplus)._M_p + 8))();
            }
            local_a0 = (undefined1  [8])0x0;
            std::__cxx11::string::~string((string *)local_80[0]._M_local_buf);
            bVar1 = consume((Parser *)msg,COMMA);
          } while (bVar1);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_80[0]._M_local_buf,"Expected \')\' after typename elements.",
                   (allocator<char> *)local_a0);
        expect((Parser *)msg,RIGHT_PAREN,(string *)local_80);
        std::__cxx11::string::~string((string *)local_80[0]._M_local_buf);
        if ((long)elementTypenames.
                  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)elementTypenames.
                  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 8) {
          *local_a8._M_head_impl =
               (Typename)
               ((elementTypenames.
                 super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
               .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
          ((elementTypenames.
            super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
          super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
          _M_t.
          super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
          .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
        }
        else {
          std::
          make_unique<enact::TupleTypename,std::vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>,enact::Token>
                    ((vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
                      *)local_80,(Token *)&elementTypenames);
          (local_a8._M_head_impl)->_vptr_Typename = (_func_int **)local_80[0]._0_8_;
        }
        std::
        vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
        ::~vector(&elementTypenames);
        std::__cxx11::string::~string((string *)&paren.lexeme);
        return (__uniq_ptr_data<const_enact::Typename,_std::default_delete<const_enact::Typename>,_true,_true>
                )(tuple<const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>)
                 local_a8._M_head_impl;
      }
      if (in_CL == '\0') {
        __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
        error(__return_storage_ptr__,(Parser *)msg,
              (string *)CONCAT71(in_register_00000011,emptyAllowed));
        __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
      std::make_unique<enact::BasicTypename,char_const(&)[1],enact::Token&>
                ((char (*) [1])&paren,(Token *)0x116165);
    }
    (local_a8._M_head_impl)->_vptr_Typename = (_func_int **)paren._0_8_;
    this = (Parser *)local_a8._M_head_impl;
  }
  return (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>)this;
}

Assistant:

std::unique_ptr<const Typename> Parser::expectTypenamePrecPrimary(const std::string &msg, bool emptyAllowed) {
        if (consume(TokenType::IDENTIFIER)) {
            return std::make_unique<BasicTypename>(m_previous);
        }

        if (consume(TokenType::DOLLAR)) {
            expect(TokenType::IDENTIFIER, "Expected type variable name after '$'.");
            return std::make_unique<VariableTypename>(m_previous);
        }

        // Unit/grouped/tuple typename?
        if (consume(TokenType::LEFT_PAREN)) {
            Token paren = m_previous;

            std::vector<std::unique_ptr<const Typename>> elementTypenames;

            if (!check(TokenType::RIGHT_PAREN)) {
                do {
                    elementTypenames.push_back(expectTypename("Expected typename after '('."));
                } while (consume(TokenType::COMMA));
            }

            expect(TokenType::RIGHT_PAREN, "Expected ')' after typename elements.");

            // 1-tuples are equivalent to their contained type
            if (elementTypenames.size() == 1) {
                return std::move(elementTypenames[0]);
            } else {
                return std::make_unique<TupleTypename>(std::move(elementTypenames), std::move(paren));
            }
        }

        if (emptyAllowed) {
            return std::make_unique<BasicTypename>("", m_previous);
        }

        throw error(msg);
    }